

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression_classes.hpp
# Opt level: O0

void __thiscall
remora::
vector_addition<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>>
::assign_to<remora::vector<double,remora::cpu_tag>>
          (vector_addition<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::scalar_matrix<int,_remora::cpu_tag,_remora::row_major>,_true>,_remora::vector<double,_remora::cpu_tag>_>,_remora::vector_scalar_multiply<remora::vector<double,_remora::cpu_tag>_>_>
           *this,vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *x)

{
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *in_RSI;
  vector_expression<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::scalar_matrix<int,_remora::cpu_tag,_remora::row_major>,_true>,_remora::vector<double,_remora::cpu_tag>_>,_remora::cpu_tag>
  *in_RDI;
  
  assign<remora::vector<double,remora::cpu_tag>,remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>,remora::cpu_tag>
            (in_RSI,in_RDI);
  plus_assign<remora::vector<double,remora::cpu_tag>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>,remora::cpu_tag>
            (in_RSI,(vector_expression<remora::vector_scalar_multiply<remora::vector<double,_remora::cpu_tag>_>,_remora::cpu_tag>
                     *)in_RDI);
  return;
}

Assistant:

void assign_to(vector_expression<VecX, device_type>& x)const{
		//working around a bug in non-dense assign
		if(!std::is_base_of<dense_tag, typename E1::evaluation_category::tag>::value){
			x().clear();
			plus_assign(x, m_lhs);
		}else{
			assign(x, m_lhs);
		}
		plus_assign(x,m_rhs);
	}